

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool absl::lts_20250127::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  anon_union_8_1_a8a14541_for_iterator_2 local_18;
  
  AssertIsValidForComparison((a->inner_).ctrl_,'\0',(GenerationType *)0x0);
  AssertIsValidForComparison((b->inner_).ctrl_,'\0',(GenerationType *)0x0);
  local_18 = (a->inner_).field_1;
  local_20 = (b->inner_).field_1;
  AssertSameContainer((a->inner_).ctrl_,(b->inner_).ctrl_,&local_18.slot_,&local_20.slot_,
                      (GenerationType *)0x0,(GenerationType *)0x0);
  return (a->inner_).ctrl_ == (b->inner_).ctrl_;
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }